

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini2sf.cpp
# Opt level: O1

void printUsage(char *cmd)

{
  undefined *puVar1;
  int i;
  long lVar2;
  
  printf("%s %s\n","rom2sf","[2015-04-08]");
  puts("======================");
  putchar(10);
  printf("%s. Created by %s.\n","Numbered mini2sf generator",
         "loveemu <http://github.com/loveemu/rom2sf>");
  putchar(10);
  puts("Usage");
  puts("-----");
  putchar(10);
  printf("Syntax: `%s <Base name> <Offset> <Size> <Count>`\n",cmd);
  putchar(10);
  puts("### Options ###");
  putchar(10);
  lVar2 = 0;
  do {
    puVar1 = (&PTR_anon_var_dwarf_5c_00106d88)[lVar2];
    puts((&PTR_anon_var_dwarf_39_00106d80)[lVar2]);
    printf("  : %s\n",puVar1);
    putchar(10);
    lVar2 = lVar2 + 2;
  } while (lVar2 == 2);
  return;
}

Assistant:

void printUsage(const char *cmd)
{
	const char *availableOptions[] = {
		"--help", "Show this help",
		"--psfby, --2sfby [name]", "Set creator name of 2SF",
	};

	printf("%s %s\n", APP_NAME, APP_VER);
	printf("======================\n");
	printf("\n");
	printf("%s. Created by %s.\n", APP_DESC, APP_AUTHOR);
	printf("\n");
	printf("Usage\n");
	printf("-----\n");
	printf("\n");
	printf("Syntax: `%s <Base name> <Offset> <Size> <Count>`\n", cmd);
	printf("\n");
	printf("### Options ###\n");
	printf("\n");

	for (int i = 0; i < sizeof(availableOptions) / sizeof(availableOptions[0]); i += 2)
	{
		printf("%s\n", availableOptions[i]);
		printf("  : %s\n", availableOptions[i + 1]);
		printf("\n");
	}
}